

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int detach_get_error(DETACH_HANDLE detach,ERROR_HANDLE *error_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  DETACH_INSTANCE *detach_instance;
  uint32_t item_count;
  int result;
  ERROR_HANDLE *error_value_local;
  DETACH_HANDLE detach_local;
  
  if (detach == (DETACH_HANDLE)0x0) {
    detach_instance._4_4_ = 0x2535;
  }
  else {
    _item_count = error_value;
    error_value_local = (ERROR_HANDLE *)detach;
    iVar1 = amqpvalue_get_composite_item_count(detach->composite_value,(uint32_t *)&detach_instance)
    ;
    if (iVar1 == 0) {
      if ((uint)detach_instance < 3) {
        detach_instance._4_4_ = 0x2543;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(detach->composite_value,2);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          detach_instance._4_4_ = 0x254b;
        }
        else {
          iVar1 = amqpvalue_get_error(value,_item_count);
          if (iVar1 == 0) {
            detach_instance._4_4_ = 0;
          }
          else {
            detach_instance._4_4_ = 0x2552;
          }
        }
      }
    }
    else {
      detach_instance._4_4_ = 0x253d;
    }
  }
  return detach_instance._4_4_;
}

Assistant:

int detach_get_error(DETACH_HANDLE detach, ERROR_HANDLE* error_value)
{
    int result;

    if (detach == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DETACH_INSTANCE* detach_instance = (DETACH_INSTANCE*)detach;
        if (amqpvalue_get_composite_item_count(detach_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 2)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(detach_instance->composite_value, 2);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_error(item_value, error_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}